

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initRustData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QLatin1String local_1568;
  char local_1551;
  QLatin1String local_1550;
  char local_1539;
  QLatin1String local_1538;
  char local_1521;
  QLatin1String local_1520;
  char local_1509;
  QLatin1String local_1508;
  char local_14f1;
  QLatin1String local_14f0;
  char local_14d9;
  QLatin1String local_14d8;
  char local_14c1;
  QLatin1String local_14c0;
  char local_14a9;
  QLatin1String local_14a8;
  char local_1491;
  QLatin1String local_1490;
  char local_1479;
  QLatin1String local_1478;
  char local_1461;
  QLatin1String local_1460;
  char local_1449;
  QLatin1String local_1448;
  char local_1431;
  QLatin1String local_1430;
  char local_1419;
  QLatin1String local_1418;
  char local_1401;
  QLatin1String local_1400;
  char local_13e9;
  QLatin1String local_13e8;
  char local_13d1;
  QLatin1String local_13d0;
  char local_13b9;
  QLatin1String local_13b8;
  char local_13a1;
  QLatin1String local_13a0;
  char local_1389;
  QLatin1String local_1388;
  char local_1371;
  QLatin1String local_1370;
  char local_1359;
  QLatin1String local_1358;
  char local_1341;
  QLatin1String local_1340;
  char local_1329;
  QLatin1String local_1328;
  char local_1311;
  QLatin1String local_1310;
  char local_12f9;
  QLatin1String local_12f8;
  char local_12e1;
  QLatin1String local_12e0;
  char local_12c9;
  QLatin1String local_12c8;
  char local_12b1;
  QLatin1String local_12b0;
  char local_1299;
  QLatin1String local_1298;
  char local_1281;
  QLatin1String local_1280;
  char local_1269;
  QLatin1String local_1268;
  char local_1251;
  QLatin1String local_1250;
  char local_1239;
  pair<char,_QLatin1String> local_1238;
  pair<char,_QLatin1String> pStack_1220;
  pair<char,_QLatin1String> pStack_1208;
  pair<char,_QLatin1String> pStack_11f0;
  pair<char,_QLatin1String> pStack_11d8;
  pair<char,_QLatin1String> pStack_11c0;
  pair<char,_QLatin1String> pStack_11a8;
  pair<char,_QLatin1String> pStack_1190;
  pair<char,_QLatin1String> pStack_1178;
  pair<char,_QLatin1String> pStack_1160;
  pair<char,_QLatin1String> pStack_1148;
  pair<char,_QLatin1String> pStack_1130;
  pair<char,_QLatin1String> pStack_1118;
  pair<char,_QLatin1String> pStack_1100;
  pair<char,_QLatin1String> pStack_10e8;
  pair<char,_QLatin1String> pStack_10d0;
  pair<char,_QLatin1String> pStack_10b8;
  pair<char,_QLatin1String> pStack_10a0;
  pair<char,_QLatin1String> pStack_1088;
  pair<char,_QLatin1String> pStack_1070;
  pair<char,_QLatin1String> pStack_1058;
  pair<char,_QLatin1String> pStack_1040;
  pair<char,_QLatin1String> pStack_1028;
  pair<char,_QLatin1String> pStack_1010;
  pair<char,_QLatin1String> pStack_ff8;
  pair<char,_QLatin1String> pStack_fe0;
  pair<char,_QLatin1String> pStack_fc8;
  pair<char,_QLatin1String> pStack_fb0;
  pair<char,_QLatin1String> pStack_f98;
  pair<char,_QLatin1String> pStack_f80;
  pair<char,_QLatin1String> pStack_f68;
  pair<char,_QLatin1String> pStack_f50;
  pair<char,_QLatin1String> pStack_f38;
  pair<char,_QLatin1String> pStack_f20;
  iterator local_f08;
  undefined8 local_f00;
  QMultiHash<char,_QLatin1String> local_ef8;
  QMultiHash<char,_QLatin1String> local_ee8;
  QLatin1String local_ed8;
  char local_ec1;
  QLatin1String local_ec0;
  char local_ea9;
  pair<char,_QLatin1String> local_ea8;
  pair<char,_QLatin1String> pStack_e90;
  iterator local_e78;
  undefined8 local_e70;
  QMultiHash<char,_QLatin1String> local_e68;
  QLatin1String local_e58;
  char local_e41;
  QLatin1String local_e40;
  char local_e29;
  QLatin1String local_e28;
  char local_e11;
  QLatin1String local_e10;
  char local_df9;
  QLatin1String local_df8;
  char local_de1;
  QLatin1String local_de0;
  char local_dc9;
  QLatin1String local_dc8;
  char local_db1;
  QLatin1String local_db0;
  char local_d99;
  QLatin1String local_d98;
  char local_d81;
  QLatin1String local_d80;
  char local_d69;
  QLatin1String local_d68;
  char local_d51;
  QLatin1String local_d50;
  char local_d39;
  QLatin1String local_d38;
  char local_d21;
  QLatin1String local_d20;
  char local_d09;
  QLatin1String local_d08;
  char local_cf1;
  QLatin1String local_cf0;
  char local_cd9;
  QLatin1String local_cd8;
  char local_cc1;
  QLatin1String local_cc0;
  char local_ca9;
  QLatin1String local_ca8;
  char local_c91;
  QLatin1String local_c90;
  char local_c79;
  QLatin1String local_c78;
  char local_c61;
  QLatin1String local_c60;
  char local_c49;
  QLatin1String local_c48;
  char local_c31;
  QLatin1String local_c30;
  char local_c19;
  QLatin1String local_c18;
  char local_c01;
  pair<char,_QLatin1String> local_c00;
  pair<char,_QLatin1String> pStack_be8;
  pair<char,_QLatin1String> pStack_bd0;
  pair<char,_QLatin1String> pStack_bb8;
  pair<char,_QLatin1String> pStack_ba0;
  pair<char,_QLatin1String> pStack_b88;
  pair<char,_QLatin1String> pStack_b70;
  pair<char,_QLatin1String> pStack_b58;
  pair<char,_QLatin1String> pStack_b40;
  pair<char,_QLatin1String> pStack_b28;
  pair<char,_QLatin1String> pStack_b10;
  pair<char,_QLatin1String> pStack_af8;
  pair<char,_QLatin1String> pStack_ae0;
  pair<char,_QLatin1String> pStack_ac8;
  pair<char,_QLatin1String> pStack_ab0;
  pair<char,_QLatin1String> pStack_a98;
  pair<char,_QLatin1String> pStack_a80;
  pair<char,_QLatin1String> pStack_a68;
  pair<char,_QLatin1String> pStack_a50;
  pair<char,_QLatin1String> pStack_a38;
  pair<char,_QLatin1String> pStack_a20;
  pair<char,_QLatin1String> pStack_a08;
  pair<char,_QLatin1String> pStack_9f0;
  pair<char,_QLatin1String> pStack_9d8;
  pair<char,_QLatin1String> pStack_9c0;
  iterator local_9a8;
  undefined8 local_9a0;
  QMultiHash<char,_QLatin1String> local_998;
  QLatin1String local_988;
  char local_971;
  QLatin1String local_970;
  char local_959;
  QLatin1String local_958;
  char local_941;
  QLatin1String local_940;
  char local_929;
  QLatin1String local_928;
  char local_911;
  QLatin1String local_910;
  char local_8f9;
  QLatin1String local_8f8;
  char local_8e1;
  QLatin1String local_8e0;
  char local_8c9;
  QLatin1String local_8c8;
  char local_8b1;
  QLatin1String local_8b0;
  char local_899;
  QLatin1String local_898;
  char local_881;
  QLatin1String local_880;
  char local_869;
  QLatin1String local_868;
  char local_851;
  QLatin1String local_850;
  char local_839;
  QLatin1String local_838;
  char local_821;
  QLatin1String local_820;
  char local_809;
  QLatin1String local_808;
  char local_7f1;
  QLatin1String local_7f0;
  char local_7d9;
  QLatin1String local_7d8;
  char local_7c1;
  QLatin1String local_7c0;
  char local_7a9;
  QLatin1String local_7a8;
  char local_791;
  QLatin1String local_790;
  char local_779;
  QLatin1String local_778;
  char local_761;
  QLatin1String local_760;
  char local_749;
  QLatin1String local_748;
  char local_731;
  QLatin1String local_730;
  char local_719;
  QLatin1String local_718;
  char local_701;
  QLatin1String local_700;
  char local_6e9;
  QLatin1String local_6e8;
  char local_6d1;
  QLatin1String local_6d0;
  char local_6b9;
  QLatin1String local_6b8;
  char local_6a1;
  QLatin1String local_6a0;
  char local_689;
  QLatin1String local_688;
  char local_671;
  QLatin1String local_670;
  char local_659;
  QLatin1String local_658;
  char local_641;
  QLatin1String local_640;
  char local_629;
  QLatin1String local_628;
  char local_611;
  QLatin1String local_610;
  char local_5f9;
  QLatin1String local_5f8;
  char local_5e1;
  QLatin1String local_5e0;
  char local_5c9;
  QLatin1String local_5c8;
  char local_5b1;
  QLatin1String local_5b0;
  char local_599;
  QLatin1String local_598;
  char local_581;
  QLatin1String local_580;
  char local_569;
  QLatin1String local_568;
  char local_551;
  QLatin1String local_550;
  char local_539;
  QLatin1String local_538;
  char local_521;
  QLatin1String local_520;
  char local_509;
  QLatin1String local_508;
  char local_4f1;
  QLatin1String local_4f0;
  char local_4d9;
  pair<char,_QLatin1String> local_4d8;
  pair<char,_QLatin1String> pStack_4c0;
  pair<char,_QLatin1String> pStack_4a8;
  pair<char,_QLatin1String> pStack_490;
  pair<char,_QLatin1String> pStack_478;
  pair<char,_QLatin1String> pStack_460;
  pair<char,_QLatin1String> pStack_448;
  pair<char,_QLatin1String> pStack_430;
  pair<char,_QLatin1String> pStack_418;
  pair<char,_QLatin1String> pStack_400;
  pair<char,_QLatin1String> pStack_3e8;
  pair<char,_QLatin1String> pStack_3d0;
  pair<char,_QLatin1String> pStack_3b8;
  pair<char,_QLatin1String> pStack_3a0;
  pair<char,_QLatin1String> pStack_388;
  pair<char,_QLatin1String> pStack_370;
  pair<char,_QLatin1String> pStack_358;
  pair<char,_QLatin1String> pStack_340;
  pair<char,_QLatin1String> pStack_328;
  pair<char,_QLatin1String> pStack_310;
  pair<char,_QLatin1String> pStack_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  pair<char,_QLatin1String> pStack_2c8;
  pair<char,_QLatin1String> pStack_2b0;
  pair<char,_QLatin1String> pStack_298;
  pair<char,_QLatin1String> pStack_280;
  pair<char,_QLatin1String> pStack_268;
  pair<char,_QLatin1String> pStack_250;
  pair<char,_QLatin1String> pStack_238;
  pair<char,_QLatin1String> pStack_220;
  pair<char,_QLatin1String> pStack_208;
  pair<char,_QLatin1String> pStack_1f0;
  pair<char,_QLatin1String> pStack_1d8;
  pair<char,_QLatin1String> pStack_1c0;
  pair<char,_QLatin1String> pStack_1a8;
  pair<char,_QLatin1String> pStack_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_4d9 = 'a';
  QLatin1String::QLatin1String(&local_4f0,"abstract");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_4d8,&local_4d9,&local_4f0);
  local_4f1 = 'a';
  QLatin1String::QLatin1String(&local_508,"alignof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4c0,&local_4f1,&local_508)
  ;
  local_509 = 'a';
  QLatin1String::QLatin1String(&local_520,"as");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4a8,&local_509,&local_520)
  ;
  local_521 = 'a';
  QLatin1String::QLatin1String(&local_538,"async");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_490,&local_521,&local_538)
  ;
  local_539 = 'a';
  QLatin1String::QLatin1String(&local_550,"await");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_478,&local_539,&local_550)
  ;
  local_551 = 'b';
  QLatin1String::QLatin1String(&local_568,"be");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_460,&local_551,&local_568)
  ;
  local_569 = 'b';
  QLatin1String::QLatin1String(&local_580,"box");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_448,&local_569,&local_580)
  ;
  local_581 = 'b';
  QLatin1String::QLatin1String(&local_598,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_430,&local_581,&local_598)
  ;
  local_599 = 'c';
  QLatin1String::QLatin1String(&local_5b0,"const");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_418,&local_599,&local_5b0)
  ;
  local_5b1 = 'c';
  QLatin1String::QLatin1String(&local_5c8,"continue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_400,&local_5b1,&local_5c8)
  ;
  local_5c9 = 'c';
  QLatin1String::QLatin1String(&local_5e0,"crate");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3e8,&local_5c9,&local_5e0)
  ;
  local_5e1 = 'd';
  QLatin1String::QLatin1String(&local_5f8,"do");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3d0,&local_5e1,&local_5f8)
  ;
  local_5f9 = 'd';
  QLatin1String::QLatin1String(&local_610,"dyn");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3b8,&local_5f9,&local_610)
  ;
  local_611 = 'e';
  QLatin1String::QLatin1String(&local_628,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3a0,&local_611,&local_628)
  ;
  local_629 = 'e';
  QLatin1String::QLatin1String(&local_640,"extern");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_388,&local_629,&local_640)
  ;
  local_641 = 'f';
  QLatin1String::QLatin1String(&local_658,"final");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_370,&local_641,&local_658)
  ;
  local_659 = 'f';
  QLatin1String::QLatin1String(&local_670,"fn");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_358,&local_659,&local_670)
  ;
  local_671 = 'f';
  QLatin1String::QLatin1String(&local_688,"for");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_340,&local_671,&local_688)
  ;
  local_689 = 'i';
  QLatin1String::QLatin1String(&local_6a0,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_328,&local_689,&local_6a0)
  ;
  local_6a1 = 'i';
  QLatin1String::QLatin1String(&local_6b8,"impl");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_310,&local_6a1,&local_6b8)
  ;
  local_6b9 = 'i';
  QLatin1String::QLatin1String(&local_6d0,"in");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2f8,&local_6b9,&local_6d0)
  ;
  local_6d1 = 'l';
  QLatin1String::QLatin1String(&local_6e8,"let");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2e0,&local_6d1,&local_6e8)
  ;
  local_6e9 = 'l';
  QLatin1String::QLatin1String(&local_700,"loop");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2c8,&local_6e9,&local_700)
  ;
  local_701 = 'm';
  QLatin1String::QLatin1String(&local_718,"match");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2b0,&local_701,&local_718)
  ;
  local_719 = 'm';
  QLatin1String::QLatin1String(&local_730,"mod");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_298,&local_719,&local_730)
  ;
  local_731 = 'm';
  QLatin1String::QLatin1String(&local_748,"move");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_280,&local_731,&local_748)
  ;
  local_749 = 'm';
  QLatin1String::QLatin1String(&local_760,"mut");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_268,&local_749,&local_760)
  ;
  local_761 = 'o';
  QLatin1String::QLatin1String(&local_778,"offsetof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_250,&local_761,&local_778)
  ;
  local_779 = 'o';
  QLatin1String::QLatin1String(&local_790,"once");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_238,&local_779,&local_790)
  ;
  local_791 = 'o';
  QLatin1String::QLatin1String(&local_7a8,"override");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_220,&local_791,&local_7a8)
  ;
  local_7a9 = 'p';
  QLatin1String::QLatin1String(&local_7c0,"priv");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_208,&local_7a9,&local_7c0)
  ;
  local_7c1 = 'p';
  QLatin1String::QLatin1String(&local_7d8,"pub");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1f0,&local_7c1,&local_7d8)
  ;
  local_7d9 = 'p';
  QLatin1String::QLatin1String(&local_7f0,"pure");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1d8,&local_7d9,&local_7f0)
  ;
  local_7f1 = 'r';
  QLatin1String::QLatin1String(&local_808,"ref");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1c0,&local_7f1,&local_808)
  ;
  local_809 = 'r';
  QLatin1String::QLatin1String(&local_820,"return");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1a8,&local_809,&local_820)
  ;
  local_821 = 's';
  QLatin1String::QLatin1String(&local_838,"sizeof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_190,&local_821,&local_838)
  ;
  local_839 = 's';
  QLatin1String::QLatin1String(&local_850,"static");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_178,&local_839,&local_850)
  ;
  local_851 = 's';
  QLatin1String::QLatin1String(&local_868,"self");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_160,&local_851,&local_868)
  ;
  local_869 = 'S';
  QLatin1String::QLatin1String(&local_880,"Self");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_148,&local_869,&local_880)
  ;
  local_881 = 's';
  QLatin1String::QLatin1String(&local_898,"super");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_130,&local_881,&local_898)
  ;
  local_899 = 't';
  QLatin1String::QLatin1String(&local_8b0,"trait");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_118,&local_899,&local_8b0)
  ;
  local_8b1 = 't';
  QLatin1String::QLatin1String(&local_8c8,"type");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_100,&local_8b1,&local_8c8)
  ;
  local_8c9 = 't';
  QLatin1String::QLatin1String(&local_8e0,"typeof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e8,&local_8c9,&local_8e0);
  local_8e1 = 'u';
  QLatin1String::QLatin1String(&local_8f8,"unsafe");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_d0,&local_8e1,&local_8f8);
  local_8f9 = 'u';
  QLatin1String::QLatin1String(&local_910,"unsized");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b8,&local_8f9,&local_910);
  local_911 = 'u';
  QLatin1String::QLatin1String(&local_928,"use");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a0,&local_911,&local_928);
  local_929 = 'v';
  QLatin1String::QLatin1String(&local_940,"virtual");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_88,&local_929,&local_940);
  local_941 = 'w';
  QLatin1String::QLatin1String(&local_958,"where");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_70,&local_941,&local_958);
  local_959 = 'w';
  QLatin1String::QLatin1String(&local_970,"while");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_959,&local_970);
  local_971 = 'y';
  QLatin1String::QLatin1String(&local_988,"yield");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_971,&local_988);
  local_28 = &local_4d8;
  local_20 = 0x32;
  list_02._M_len = 0x32;
  list_02._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&rust_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  local_c01 = 'u';
  QLatin1String::QLatin1String(&local_c18,"union");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_c00,&local_c01,&local_c18);
  local_c19 = 'e';
  QLatin1String::QLatin1String(&local_c30,"enum");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_be8,&local_c19,&local_c30)
  ;
  local_c31 = 's';
  QLatin1String::QLatin1String(&local_c48,"struct");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_bd0,&local_c31,&local_c48)
  ;
  local_c49 = 'i';
  QLatin1String::QLatin1String(&local_c60,"i8");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_bb8,&local_c49,&local_c60)
  ;
  local_c61 = 'i';
  QLatin1String::QLatin1String(&local_c78,"i16");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ba0,&local_c61,&local_c78)
  ;
  local_c79 = 'i';
  QLatin1String::QLatin1String(&local_c90,"i32");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b88,&local_c79,&local_c90)
  ;
  local_c91 = 'i';
  QLatin1String::QLatin1String(&local_ca8,"i64");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b70,&local_c91,&local_ca8)
  ;
  local_ca9 = 'i';
  QLatin1String::QLatin1String(&local_cc0,"i128");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b58,&local_ca9,&local_cc0)
  ;
  local_cc1 = 'i';
  QLatin1String::QLatin1String(&local_cd8,"isize");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b40,&local_cc1,&local_cd8)
  ;
  local_cd9 = 'u';
  QLatin1String::QLatin1String(&local_cf0,"u8");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b28,&local_cd9,&local_cf0)
  ;
  local_cf1 = 'u';
  QLatin1String::QLatin1String(&local_d08,"u16");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b10,&local_cf1,&local_d08)
  ;
  local_d09 = 'u';
  QLatin1String::QLatin1String(&local_d20,"u32");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_af8,&local_d09,&local_d20)
  ;
  local_d21 = 'u';
  QLatin1String::QLatin1String(&local_d38,"u64");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ae0,&local_d21,&local_d38)
  ;
  local_d39 = 'u';
  QLatin1String::QLatin1String(&local_d50,"u128");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ac8,&local_d39,&local_d50)
  ;
  local_d51 = 'u';
  QLatin1String::QLatin1String(&local_d68,"usize");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ab0,&local_d51,&local_d68)
  ;
  local_d69 = 'f';
  QLatin1String::QLatin1String(&local_d80,"f32");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a98,&local_d69,&local_d80)
  ;
  local_d81 = 'f';
  QLatin1String::QLatin1String(&local_d98,"f64");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a80,&local_d81,&local_d98)
  ;
  local_d99 = 's';
  QLatin1String::QLatin1String(&local_db0,"str");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a68,&local_d99,&local_db0)
  ;
  local_db1 = 'c';
  QLatin1String::QLatin1String(&local_dc8,"char");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a50,&local_db1,&local_dc8)
  ;
  local_dc9 = 'b';
  QLatin1String::QLatin1String(&local_de0,"bool");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a38,&local_dc9,&local_de0)
  ;
  local_de1 = 'B';
  QLatin1String::QLatin1String(&local_df8,"Box");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a20,&local_de1,&local_df8)
  ;
  local_df9 = 'O';
  QLatin1String::QLatin1String(&local_e10,"Option");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a08,&local_df9,&local_e10)
  ;
  local_e11 = 'R';
  QLatin1String::QLatin1String(&local_e28,"Result");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_9f0,&local_e11,&local_e28)
  ;
  local_e29 = 'S';
  QLatin1String::QLatin1String(&local_e40,"String");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_9d8,&local_e29,&local_e40)
  ;
  local_e41 = 'V';
  QLatin1String::QLatin1String(&local_e58,"Vec");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_9c0,&local_e41,&local_e58)
  ;
  local_9a8 = &local_c00;
  local_9a0 = 0x19;
  list_01._M_len = 0x19;
  list_01._M_array = local_9a8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_998,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&rust_types,&local_998);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_998);
  local_ea9 = 'f';
  QLatin1String::QLatin1String(&local_ec0,"false");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_ea8,&local_ea9,&local_ec0);
  local_ec1 = 't';
  QLatin1String::QLatin1String(&local_ed8,"true");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e90,&local_ec1,&local_ed8)
  ;
  local_e78 = &local_ea8;
  local_e70 = 2;
  list_00._M_len = 2;
  list_00._M_array = local_e78;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_e68,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&rust_literals,&local_e68);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_e68);
  memset(&local_ee8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_ee8);
  QMultiHash<char,_QLatin1String>::operator=(&rust_builtin,&local_ee8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_ee8);
  local_1239 = 'a';
  QLatin1String::QLatin1String(&local_1250,"assert!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_1238,&local_1239,&local_1250);
  local_1251 = 'a';
  QLatin1String::QLatin1String(&local_1268,"assert_eq!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1220,&local_1251,&local_1268);
  local_1269 = 'b';
  QLatin1String::QLatin1String(&local_1280,"bitflags!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1208,&local_1269,&local_1280);
  local_1281 = 'b';
  QLatin1String::QLatin1String(&local_1298,"bytes!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11f0,&local_1281,&local_1298);
  local_1299 = 'c';
  QLatin1String::QLatin1String(&local_12b0,"cfg!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11d8,&local_1299,&local_12b0);
  local_12b1 = 'c';
  QLatin1String::QLatin1String(&local_12c8,"col!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11c0,&local_12b1,&local_12c8);
  local_12c9 = 'c';
  QLatin1String::QLatin1String(&local_12e0,"concat!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11a8,&local_12c9,&local_12e0);
  local_12e1 = 'c';
  QLatin1String::QLatin1String(&local_12f8,"concat_idents!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1190,&local_12e1,&local_12f8);
  local_12f9 = 'd';
  QLatin1String::QLatin1String(&local_1310,"debug_assert!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1178,&local_12f9,&local_1310);
  local_1311 = 'd';
  QLatin1String::QLatin1String(&local_1328,"debug_assert_eq!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1160,&local_1311,&local_1328);
  local_1329 = 'e';
  QLatin1String::QLatin1String(&local_1340,"env!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1148,&local_1329,&local_1340);
  local_1341 = 'p';
  QLatin1String::QLatin1String(&local_1358,"panic!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1130,&local_1341,&local_1358);
  local_1359 = 'f';
  QLatin1String::QLatin1String(&local_1370,"file!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1118,&local_1359,&local_1370);
  local_1371 = 'f';
  QLatin1String::QLatin1String(&local_1388,"format!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1100,&local_1371,&local_1388);
  local_1389 = 'f';
  QLatin1String::QLatin1String(&local_13a0,"format_args!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10e8,&local_1389,&local_13a0);
  local_13a1 = 'i';
  QLatin1String::QLatin1String(&local_13b8,"include_bin!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10d0,&local_13a1,&local_13b8);
  local_13b9 = 'i';
  QLatin1String::QLatin1String(&local_13d0,"include_str!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10b8,&local_13b9,&local_13d0);
  local_13d1 = 'l';
  QLatin1String::QLatin1String(&local_13e8,"line!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10a0,&local_13d1,&local_13e8);
  local_13e9 = 'l';
  QLatin1String::QLatin1String(&local_1400,"local_data_key!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1088,&local_13e9,&local_1400);
  local_1401 = 'm';
  QLatin1String::QLatin1String(&local_1418,"module_path!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1070,&local_1401,&local_1418);
  local_1419 = 'o';
  QLatin1String::QLatin1String(&local_1430,"option_env!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1058,&local_1419,&local_1430);
  local_1431 = 'p';
  QLatin1String::QLatin1String(&local_1448,"print!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1040,&local_1431,&local_1448);
  local_1449 = 'p';
  QLatin1String::QLatin1String(&local_1460,"println!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1028,&local_1449,&local_1460);
  local_1461 = 's';
  QLatin1String::QLatin1String(&local_1478,"select!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1010,&local_1461,&local_1478);
  local_1479 = 's';
  QLatin1String::QLatin1String(&local_1490,"stringify!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ff8,&local_1479,&local_1490);
  local_1491 = 't';
  QLatin1String::QLatin1String(&local_14a8,"try!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fe0,&local_1491,&local_14a8);
  local_14a9 = 'u';
  QLatin1String::QLatin1String(&local_14c0,"unimplemented!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fc8,&local_14a9,&local_14c0);
  local_14c1 = 'u';
  QLatin1String::QLatin1String(&local_14d8,"unreachable!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fb0,&local_14c1,&local_14d8);
  local_14d9 = 'v';
  QLatin1String::QLatin1String(&local_14f0,"vec!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f98,&local_14d9,&local_14f0);
  local_14f1 = 'w';
  QLatin1String::QLatin1String(&local_1508,"write!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f80,&local_14f1,&local_1508);
  local_1509 = 'w';
  QLatin1String::QLatin1String(&local_1520,"writeln!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f68,&local_1509,&local_1520);
  local_1521 = 'm';
  QLatin1String::QLatin1String(&local_1538,"macro_rules!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f50,&local_1521,&local_1538);
  local_1539 = 'a';
  QLatin1String::QLatin1String(&local_1550,"assert_ne!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f38,&local_1539,&local_1550);
  local_1551 = 'd';
  QLatin1String::QLatin1String(&local_1568,"debug_assert_ne!");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f20,&local_1551,&local_1568);
  local_f08 = &local_1238;
  local_f00 = 0x22;
  list._M_len = 0x22;
  list._M_array = local_f08;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_ef8,list);
  QMultiHash<char,_QLatin1String>::operator=(&rust_other,&local_ef8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_ef8);
  return;
}

Assistant:

void initRustData() {
    rust_keywords = {
        {('a'), QLatin1String("abstract")}, {('a'), QLatin1String("alignof")},
        {('a'), QLatin1String("as")},       {('a'), QLatin1String("async")},
        {('a'), QLatin1String("await")},    {('b'), QLatin1String("be")},
        {('b'), QLatin1String("box")},      {('b'), QLatin1String("break")},
        {('c'), QLatin1String("const")},    {('c'), QLatin1String("continue")},
        {('c'), QLatin1String("crate")},    {('d'), QLatin1String("do")},
        {('d'), QLatin1String("dyn")},      {('e'), QLatin1String("else")},
        {('e'), QLatin1String("extern")},   {('f'), QLatin1String("final")},
        {('f'), QLatin1String("fn")},       {('f'), QLatin1String("for")},
        {('i'), QLatin1String("if")},       {('i'), QLatin1String("impl")},
        {('i'), QLatin1String("in")},       {('l'), QLatin1String("let")},
        {('l'), QLatin1String("loop")},     {('m'), QLatin1String("match")},
        {('m'), QLatin1String("mod")},      {('m'), QLatin1String("move")},
        {('m'), QLatin1String("mut")},      {('o'), QLatin1String("offsetof")},
        {('o'), QLatin1String("once")},     {('o'), QLatin1String("override")},
        {('p'), QLatin1String("priv")},     {('p'), QLatin1String("pub")},
        {('p'), QLatin1String("pure")},     {('r'), QLatin1String("ref")},
        {('r'), QLatin1String("return")},   {('s'), QLatin1String("sizeof")},
        {('s'), QLatin1String("static")},   {('s'), QLatin1String("self")},
        {('S'), QLatin1String("Self")},     {('s'), QLatin1String("super")},
        {('t'), QLatin1String("trait")},    {('t'), QLatin1String("type")},
        {('t'), QLatin1String("typeof")},   {('u'), QLatin1String("unsafe")},
        {('u'), QLatin1String("unsized")},  {('u'), QLatin1String("use")},
        {('v'), QLatin1String("virtual")},  {('w'), QLatin1String("where")},
        {('w'), QLatin1String("while")},    {('y'), QLatin1String("yield")},
    };

    rust_types = {
        {('u'), QLatin1String("union")},  {('e'), QLatin1String("enum")},
        {('s'), QLatin1String("struct")},

        {('i'), QLatin1String("i8")},     {('i'), QLatin1String("i16")},
        {('i'), QLatin1String("i32")},    {('i'), QLatin1String("i64")},
        {('i'), QLatin1String("i128")},   {('i'), QLatin1String("isize")},
        {('u'), QLatin1String("u8")},     {('u'), QLatin1String("u16")},
        {('u'), QLatin1String("u32")},    {('u'), QLatin1String("u64")},
        {('u'), QLatin1String("u128")},   {('u'), QLatin1String("usize")},
        {('f'), QLatin1String("f32")},    {('f'), QLatin1String("f64")},
        {('s'), QLatin1String("str")},    {('c'), QLatin1String("char")},
        {('b'), QLatin1String("bool")},   {('B'), QLatin1String("Box")},
        {('O'), QLatin1String("Option")}, {('R'), QLatin1String("Result")},
        {('S'), QLatin1String("String")}, {('V'), QLatin1String("Vec")}};

    rust_literals = {{('f'), QLatin1String("false")},
                     {('t'), QLatin1String("true")}};

    rust_builtin = {

    };

    rust_other = {{('a'), QLatin1String("assert!")},
                  {('a'), QLatin1String("assert_eq!")},
                  {('b'), QLatin1String("bitflags!")},
                  {('b'), QLatin1String("bytes!")},
                  {('c'), QLatin1String("cfg!")},
                  {('c'), QLatin1String("col!")},
                  {('c'), QLatin1String("concat!")},
                  {('c'), QLatin1String("concat_idents!")},
                  {('d'), QLatin1String("debug_assert!")},
                  {('d'), QLatin1String("debug_assert_eq!")},
                  {('e'), QLatin1String("env!")},
                  {('p'), QLatin1String("panic!")},
                  {('f'), QLatin1String("file!")},
                  {('f'), QLatin1String("format!")},
                  {('f'), QLatin1String("format_args!")},
                  {('i'), QLatin1String("include_bin!")},
                  {('i'), QLatin1String("include_str!")},
                  {('l'), QLatin1String("line!")},
                  {('l'), QLatin1String("local_data_key!")},
                  {('m'), QLatin1String("module_path!")},
                  {('o'), QLatin1String("option_env!")},
                  {('p'), QLatin1String("print!")},
                  {('p'), QLatin1String("println!")},
                  {('s'), QLatin1String("select!")},
                  {('s'), QLatin1String("stringify!")},
                  {('t'), QLatin1String("try!")},
                  {('u'), QLatin1String("unimplemented!")},
                  {('u'), QLatin1String("unreachable!")},
                  {('v'), QLatin1String("vec!")},
                  {('w'), QLatin1String("write!")},
                  {('w'), QLatin1String("writeln!")},
                  {('m'), QLatin1String("macro_rules!")},
                  {('a'), QLatin1String("assert_ne!")},
                  {('d'), QLatin1String("debug_assert_ne!")}};
}